

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

available_transtions_table *
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,afsm::test::ortho_sm_def,unsigned_long>
::get_available_transitions_table<0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  int iVar1;
  type_tuple<afsm::test::events::power_on> local_a;
  type_tuple<afsm::test::events::power_off> local_9;
  
  if (get_available_transitions_table<0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)::_table ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&get_available_transitions_table<0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      afsm::detail::make_event_set<afsm::test::events::power_off>
                (state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
                 ::get_available_transitions_table<0UL,_1UL>::_table._M_elems,&local_9);
      afsm::detail::make_event_set<afsm::test::events::power_on>
                (state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
                 ::get_available_transitions_table<0UL,_1UL>::_table._M_elems + 1,&local_a);
      __cxa_atexit(std::
                   array<std::set<const_afsm::detail::event_base::id_type_*,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>,_2UL>
                   ::~array,&state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
                             ::get_available_transitions_table<0UL,_1UL>::_table,&__dso_handle);
      __cxa_guard_release(&get_available_transitions_table<0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                           ::_table);
    }
  }
  return &state_transition_table<afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::ortho_sm_def,_unsigned_long>
          ::get_available_transitions_table<0UL,_1UL>::_table;
}

Assistant:

static available_transtions_table const&
    get_available_transitions_table( ::psst::meta::indexes_tuple< Indexes ...> const& )
    {
        static available_transtions_table _table{{
            ::afsm::detail::make_event_set(
                typename ::psst::meta::transform<
                    def::detail::event_type,
                    typename ::psst::meta::find_if<
                        def::originates_from<
                            typename inner_states_def::template type< Indexes >
                        >:: template type,
                        transitions_tuple
                    >::type
                 > ::type {}
            ) ...
        }};

        return _table;
    }